

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O2

NodeText * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeNodeTextWithoutNested
          (NodeText *__return_storage_ptr__,CapnpcCppMain *this,StringPtr namespace_,StringPtr scope
          ,StringPtr name,Schema schema,Array<kj::StringTree> *nestedTypeDecls,
          TemplateContext *templateContext)

{
  Field field;
  Reader proto_00;
  Reader proto_01;
  Reader value;
  Reader proto_02;
  Reader proto_03;
  Reader value_00;
  Array<kj::StringTree> nestedTypeDecls_00;
  StringPtr hexId_00;
  RemoveConst<kj::StringTree> *pRVar1;
  size_t sVar2;
  bool bVar3;
  Which WVar4;
  undefined2 uVar5;
  uint32_t uVar6;
  FieldText *pFVar7;
  long lVar8;
  InterfaceSchema schema_00;
  size_t sVar9;
  StringTree *pSVar10;
  NullableValue<capnp::schema::Value::Reader> *pNVar11;
  char *pcVar12;
  uint *params_1;
  StringTree *pSVar13;
  Schema SVar14;
  FieldText *pFVar15;
  uint64_t annotationId;
  uint64_t annotationId_00;
  StringTree *params;
  CappedArray<char,_17UL> *params_00;
  char (*params_01) [31];
  char (*params_02) [25];
  TemplateContext *pTVar16;
  unsigned_long uVar17;
  CapnpcCppMain *pCVar18;
  ArrayBuilder<kj::StringTree> *this_00;
  CappedArray<char,_17UL> *params_2;
  long *plVar19;
  char *pcVar20;
  anon_union_8_2_eba6ea51_for_Type_5 aVar21;
  int iVar22;
  ulong count;
  RemoveConst<kj::StringTree> *pRVar23;
  long lVar24;
  bool bVar25;
  StringPtr suffix;
  StringPtr scope_00;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr type_00;
  StringPtr type_01;
  Type TVar26;
  StringPtr SVar27;
  ReaderFor<capnp::Text> RVar28;
  ReaderFor<capnp::Data> RVar29;
  StringPtr innerName;
  StringPtr fullName_00;
  StringPtr suffix_00;
  StringPtr suffix_01;
  ArrayDisposer *pAVar30;
  char (*params_9) [348];
  ArrayPtr<const_char> *pAVar31;
  char (*pacVar32) [3];
  char (*pacVar33) [4];
  TemplateContext *in_stack_fffffffffffff5f8;
  ArrayBuilder<kj::StringTree> builder_1;
  uint local_9c8;
  undefined4 uStack_9c4;
  Impl *pIStack_9c0;
  ArrayBuilder<kj::StringTree> builder;
  ArrayBuilder<kj::StringTree> builder_4;
  Branch *local_948;
  size_t sStack_940;
  ArrayDisposer *local_938;
  char *local_910;
  ArrayPtr<const_char> local_908;
  uint discrimOffset;
  String fullName;
  Schema schema_local;
  CppTypeName whichName;
  String constType;
  Schema local_840;
  Reader structNode;
  StringTree local_808;
  Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText> fieldTexts;
  undefined1 local_7b0 [24];
  String upperCase;
  StringTree declareText;
  ArrayBuilder<kj::StringTree> builder_3;
  Array<kj::StringTree> local_708;
  ArrayPtr<const_char> local_6f0;
  Reader proto_1;
  StringTree defineText;
  char *local_650;
  char *local_648;
  undefined1 local_640 [56];
  size_t sStack_608;
  Type type;
  ArrayPtr<const_char> local_558;
  size_t local_548;
  anon_union_8_2_eba6ea51_for_Type_5 local_520;
  TemplateContext *local_518;
  char *local_510;
  long local_508;
  Array<kj::StringTree> local_500;
  undefined1 local_4e8 [32];
  Branch *local_4c8;
  undefined8 *local_4c0;
  undefined1 local_4b8 [48];
  StringTree local_488;
  char *local_450;
  StringTree local_448;
  String subScope;
  NullableValue<capnp::schema::Value::Reader> annotatedName_1;
  StringTree local_3c0;
  StringTree local_388;
  StringTree local_350;
  NullableValue<capnp::schema::Value::Reader> annotatedName;
  undefined1 local_2e0 [56];
  StringTree local_2a8;
  StringTree local_270;
  StringTree local_238;
  StringTree *local_1f8;
  StringTree *pSStack_1f0;
  ArrayPtr<const_char> local_1e8;
  ArrayPtr<const_char> local_1d8;
  ArrayPtr<const_char> local_1c8;
  ArrayPtr<const_char> local_1b8;
  ArrayPtr<const_char> local_1a8;
  ArrayPtr<const_char> local_198;
  ArrayPtr<const_char> local_188;
  ArrayPtr<const_char> local_178;
  ArrayPtr<const_char> local_168;
  undefined1 local_158 [56];
  long local_120;
  long local_118;
  CappedArray<char,_17UL> hexId;
  String templates;
  Reader proto;
  CappedArray<char,_17UL> hexId_1;
  undefined1 local_88 [32];
  Branch *local_68;
  size_t sStack_60;
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  char (*params_2_00) [6];
  
  plVar19 = (long *)scope.content.size_;
  pSVar13 = (StringTree *)scope.content.ptr;
  pcVar20 = (char *)namespace_.content.size_;
  schema_local.raw = (RawBrandedSchema *)pSVar13;
  Schema::getProto(&proto,&schema_local);
  proto_00._reader.pointerCount = proto._reader.pointerCount;
  proto_00._reader._38_2_ = proto._reader._38_2_;
  proto_00._reader.dataSize = proto._reader.dataSize;
  proto_00._reader.capTable = proto._reader.capTable;
  proto_00._reader.segment = proto._reader.segment;
  proto_00._reader.data = proto._reader.data;
  proto_00._reader.pointers = proto._reader.pointers;
  proto_00._reader.nestingLimit = proto._reader.nestingLimit;
  proto_00._reader._44_4_ = proto._reader._44_4_;
  annotationValue<capnp::schema::Node::Reader>
            ((Maybe<capnp::schema::Value::Reader> *)&annotatedName_1,
             (CapnpcCppMain *)0xf264a779fef191ce,proto_00,annotationId);
  if (annotatedName_1.isSet == true) {
    annotatedName.field_1._32_8_ = annotatedName_1.field_1._32_8_;
    annotatedName.field_1._40_8_ = annotatedName_1.field_1._40_8_;
    annotatedName.field_1.value._reader.data = annotatedName_1.field_1.value._reader.data;
    annotatedName.field_1.value._reader.pointers = annotatedName_1.field_1.value._reader.pointers;
    annotatedName.field_1.value._reader.segment = annotatedName_1.field_1.value._reader.segment;
    annotatedName.field_1.value._reader.capTable = annotatedName_1.field_1.value._reader.capTable;
    name.content = (ArrayPtr<const_char>)
                   capnp::schema::Value::Reader::getText(&annotatedName.field_1.value);
  }
  if (proto._reader.dataSize < 0x40) {
    uVar17 = 0;
  }
  else {
    uVar17 = *proto._reader.data;
  }
  kj::hex(&hexId,uVar17);
  SVar27 = name;
  if (proto._reader.dataSize < 0x70) {
switchD_0018506e_caseD_0:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[47]>
              ((Fault *)&annotatedName,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnpc-c++.c++"
               ,0xafd,FAILED,(char *)0x0,"\"This method shouldn\'t be called on file nodes.\"",
               (char (*) [47])"This method shouldn\'t be called on file nodes.");
    kj::_::Debug::Fault::fatal((Fault *)&annotatedName);
  }
  pcVar12 = name.content.ptr;
  sVar9 = name.content.size_;
  switch(*(undefined2 *)((long)proto._reader.data + 0xc)) {
  case 0:
    goto switchD_0018506e_caseD_0;
  case 1:
    local_840.raw = (RawBrandedSchema *)Schema::asStruct(&schema_local);
    local_708.ptr = (StringTree *)*plVar19;
    local_708.size_ = plVar19[1];
    local_708.disposer = (ArrayDisposer *)plVar19[2];
    *plVar19 = 0;
    plVar19[1] = 0;
    local_908 = SVar27.content;
    local_650 = namespace_.content.ptr;
    local_648 = pcVar20;
    Schema::getProto(&proto_1,&local_840);
    proto_01._reader.pointerCount = proto_1._reader.pointerCount;
    proto_01._reader._38_2_ = proto_1._reader._38_2_;
    proto_01._reader.dataSize = proto_1._reader.dataSize;
    proto_01._reader.capTable = proto_1._reader.capTable;
    proto_01._reader.segment = proto_1._reader.segment;
    proto_01._reader.data = proto_1._reader.data;
    proto_01._reader.pointers = proto_1._reader.pointers;
    proto_01._reader.nestingLimit = proto_1._reader.nestingLimit;
    proto_01._reader._44_4_ = proto_1._reader._44_4_;
    annotationValue<capnp::schema::Node::Reader>
              ((Maybe<capnp::schema::Value::Reader> *)local_640,(CapnpcCppMain *)0xf264a779fef191ce,
               proto_01,annotationId_00);
    annotatedName_1.isSet = local_640[0];
    if (local_640[0] == true) {
      annotatedName_1.field_1._32_8_ = local_640._40_8_;
      annotatedName_1.field_1._40_8_ = local_640._48_8_;
      annotatedName_1.field_1.value._reader.data = (void *)local_640._24_8_;
      annotatedName_1.field_1.value._reader.pointers = (WirePointer *)local_640._32_8_;
      annotatedName_1.field_1.value._reader.segment = (SegmentReader *)local_640._8_8_;
      annotatedName_1.field_1.value._reader.capTable = (CapTableReader *)local_640._16_8_;
      local_908 = (ArrayPtr<const_char>)
                  capnp::schema::Value::Reader::getText(&annotatedName_1.field_1.value);
    }
    suffix.content.size_ = 1;
    suffix.content.ptr = "";
    TemplateContext::args((StringTree *)&annotatedName_1,(TemplateContext *)schema.raw,suffix);
    pNVar11 = &annotatedName_1;
    kj::str<kj::StringPtr&,kj::StringPtr&,kj::StringTree>
              (&fullName,(kj *)&local_650,(StringPtr *)&local_908,(StringPtr *)pNVar11,pSVar13);
    kj::StringTree::~StringTree((StringTree *)&annotatedName_1);
    kj::str<kj::String&,char_const(&)[3]>
              (&subScope,(kj *)&fullName,(String *)0x23ffac,&pNVar11->isSet);
    StructSchema::getFields((FieldList *)&builder_4,(StructSchema *)&local_840);
    whichName.name.branches.disposer._0_4_ = (int)local_938;
    whichName.name.branches.disposer._4_4_ = (undefined4)((ulong)local_938 >> 0x20);
    whichName.name.branches.ptr = local_948;
    whichName.name.branches.size_._0_4_ = (StructDataBitCount)sStack_940;
    whichName.name.branches.size_._4_4_ = (undefined4)(sStack_940 >> 0x20);
    whichName.name.text.content.size_ = (size_t)builder_4.endPtr;
    whichName.name.text.content.disposer = builder_4.disposer;
    whichName.name.size_ = (size_t)builder_4.ptr;
    whichName.name.text.content.ptr = (char *)builder_4.pos;
    iVar22 = 0;
    pFVar7 = (FieldText *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (0xe0,0,(ulong)local_948 & 0xffffffff,(_func_void_void_ptr *)0x0,
                        (_func_void_void_ptr *)0x0);
    builder_1.endPtr = &pFVar7[(ulong)local_948 & 0xffffffff].readerMethodDecls;
    builder_1.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    builder.ptr = &whichName.name;
    lVar8 = 0;
    builder_1.ptr = (StringTree *)pFVar7;
    builder_1.pos = (RemoveConst<kj::StringTree> *)pFVar7;
    while( true ) {
      builder.pos._0_4_ = iVar22;
      if (iVar22 == (int)whichName.name.branches.ptr) break;
      _::IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::
      operator*((Field *)local_640,
                (IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                 *)&builder);
      pcVar20 = "";
      if (subScope.content.size_ != 0) {
        pcVar20 = subScope.content.ptr;
      }
      scope_00.content.size_ = subScope.content.size_ + (subScope.content.size_ == 0);
      field.parent.super_Schema.raw._1_1_ = local_640[1];
      field.parent.super_Schema.raw._0_1_ = local_640[0];
      field.parent.super_Schema.raw._2_6_ = local_640._2_6_;
      field._8_8_ = local_640._8_8_;
      field.proto._reader.segment = (SegmentReader *)local_640._16_8_;
      field.proto._reader.capTable = (CapTableReader *)local_640._24_8_;
      field.proto._reader.data = (void *)local_640._32_8_;
      field.proto._reader.pointers = (WirePointer *)local_640._40_8_;
      field.proto._reader.dataSize = local_640._48_4_;
      field.proto._reader.pointerCount = local_640._52_2_;
      field.proto._reader._38_2_ = local_640._54_2_;
      field.proto._reader._40_8_ = sStack_608;
      scope_00.content.ptr = pcVar20;
      makeFieldText((FieldText *)&annotatedName_1,this,scope_00,field,(TemplateContext *)schema.raw)
      ;
      kj::StringTree::StringTree
                ((StringTree *)((long)&(pFVar7->readerMethodDecls).size_ + lVar8),
                 (StringTree *)&annotatedName_1);
      kj::StringTree::StringTree
                ((StringTree *)((long)&(pFVar7->builderMethodDecls).size_ + lVar8),&local_3c0);
      kj::StringTree::StringTree
                ((StringTree *)((long)&(pFVar7->pipelineMethodDecls).size_ + lVar8),&local_388);
      kj::StringTree::StringTree
                ((StringTree *)((long)&(pFVar7->inlineMethodDefs).size_ + lVar8),&local_350);
      FieldText::~FieldText((FieldText *)&annotatedName_1);
      iVar22 = (int)builder.pos + 1;
      lVar8 = lVar8 + 0xe0;
    }
    sVar9 = lVar8 / 0xe0;
    fieldTexts.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    builder_1.ptr = (StringTree *)0x0;
    builder_1.pos = (RemoveConst<kj::StringTree> *)0x0;
    builder_1.endPtr = (StringTree *)0x0;
    fieldTexts.ptr = pFVar7;
    fieldTexts.size_ = sVar9;
    local_508 = lVar8;
    kj::ArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText>::~ArrayBuilder
              ((ArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText> *)&builder_1);
    structNode._reader._32_8_ = ZEXT48(proto_1._reader.dataSize);
    structNode._reader.nestingLimit = proto_1._reader.nestingLimit;
    structNode._reader._44_4_ = proto_1._reader._44_4_;
    structNode._reader.data = proto_1._reader.data;
    structNode._reader.pointers = proto_1._reader.pointers;
    structNode._reader.segment = proto_1._reader.segment;
    structNode._reader.capTable = proto_1._reader.capTable;
    discrimOffset = 0;
    if (0x11f < proto_1._reader.dataSize) {
      discrimOffset = *(uint *)((long)proto_1._reader.data + 0x20);
    }
    if (proto_1._reader.dataSize < 0x40) {
      uVar17 = 0;
    }
    else {
      uVar17 = *proto_1._reader.data;
    }
    kj::hex(&hexId_1,uVar17);
    TemplateContext::allDecls((StringTree *)&annotatedName_1,(TemplateContext *)schema.raw);
    kj::_::concat<kj::StringTree>(&templates,(_ *)&annotatedName_1,params);
    kj::StringTree::~StringTree((StringTree *)&annotatedName_1);
    if (structNode._reader.dataSize < 0x80) {
      annotatedName_1.isSet = false;
      annotatedName_1._1_1_ = 0;
LAB_00185c2c:
      uVar5 = 0;
    }
    else {
      annotatedName_1.isSet = SUB21(*(undefined2 *)((long)structNode._reader.data + 0xe),0);
      annotatedName_1._1_1_ =
           SUB21((ushort)*(undefined2 *)((long)structNode._reader.data + 0xe) >> 8,0);
      if (structNode._reader.dataSize < 0xd0) goto LAB_00185c2c;
      uVar5 = *(undefined2 *)((long)structNode._reader.data + 0x18);
    }
    local_640[0] = SUB21(uVar5,0);
    local_640[1] = (char)((ushort)uVar5 >> 8);
    kj::
    strTree<char_const(&)[58],kj::CappedArray<char,17ul>&,char_const(&)[3],unsigned_short,char_const(&)[3],unsigned_short,char_const(&)[3]>
              (&declareText,(kj *)"  struct _capnpPrivate {\n    CAPNP_DECLARE_STRUCT_HEADER(",
               (char (*) [58])&hexId_1,(CappedArray<char,_17UL> *)0x241176,&annotatedName_1.isSet,
               (unsigned_short *)0x241176,(char (*) [3])local_640,(unsigned_short *)")\n",
               (char (*) [3])in_stack_fffffffffffff5f8);
    pcVar20 = "constexpr uint16_t ";
    pSVar13 = (StringTree *)0x240546;
    kj::
    strTree<char_const(&)[4],kj::String&,char_const(&)[2],kj::String&,char_const(&)[20],kj::String&,char_const(&)[32],kj::String&,char_const(&)[20],kj::String&,char_const(&)[48],kj::String&,char_const(&)[25],kj::String&,char_const(&)[24],kj::String&,char_const(&)[40],kj::String&,char_const(&)[26]>
              (&defineText,(kj *)"// ",(char (*) [4])&fullName,(String *)0x240546,
               (char (*) [2])&templates,(String *)"constexpr uint16_t ",(char (*) [20])&fullName,
               (String *)"::_capnpPrivate::dataWordSize;\n",(char (*) [32])&templates,
               (String *)"constexpr uint16_t ",(char (*) [20])&fullName,
               (String *)"::_capnpPrivate::pointerCount;\n#if !CAPNP_LITE\n",
               (char (*) [48])&templates,(String *)"constexpr ::capnp::Kind ",
               (char (*) [25])&fullName,(String *)"::_capnpPrivate::kind;\n",
               (char (*) [24])&templates,(String *)"constexpr ::capnp::_::RawSchema const* ",
               (char (*) [40])&fullName,(String *)"::_capnpPrivate::schema;\n",
               (char (*) [26])in_stack_fffffffffffff5f8);
    if ((*(uint *)&schema.raw[1].dependencies < 0x121) ||
       (((ulong)(schema.raw[1].generic)->membersByName & 0x100000000) == 0)) {
      kj::strTree<kj::StringTree,char_const(&)[147]>
                ((StringTree *)&annotatedName_1,(kj *)&declareText,
                 (StringTree *)
                 "    #if !CAPNP_LITE\n    static constexpr ::capnp::_::RawBrandedSchema const* brand() { return &schema->defaultBrand; }\n    #endif  // !CAPNP_LITE\n"
                 ,(char (*) [147])pSVar13);
      kj::StringTree::operator=(&declareText,(StringTree *)&annotatedName_1);
      kj::StringTree::~StringTree((StringTree *)&annotatedName_1);
    }
    else {
      SVar14.raw = local_840.raw;
      makeBrandInitializers
                ((BrandInitializerText *)&annotatedName_1,this,(TemplateContext *)schema.raw,
                 local_840);
      makeGenericDeclarations
                (&whichName.name,(CapnpcCppMain *)schema.raw,
                 (TemplateContext *)(ulong)((Disposer *)local_388.size_ != (Disposer *)0x0),
                 SUB81(SVar14.raw,0));
      kj::strTree<kj::StringTree,char_const(&)[21],kj::StringTree,char_const(&)[28]>
                ((StringTree *)local_640,(kj *)&declareText,(StringTree *)"    #if !CAPNP_LITE\n",
                 (char (*) [21])&whichName,(StringTree *)0x2403a5,(char (*) [28])pcVar20);
      kj::StringTree::operator=(&declareText,(StringTree *)local_640);
      kj::StringTree::~StringTree((StringTree *)local_640);
      kj::StringTree::~StringTree(&whichName.name);
      sVar2 = fullName.content.size_;
      pTVar16 = (TemplateContext *)fullName.content.ptr;
      kj::str<kj::CappedArray<char,17ul>&>((String *)&builder_1,(kj *)&hexId_1,params_00);
      if (sVar2 == 0) {
        pTVar16 = (TemplateContext *)0x240547;
      }
      local_1f8 = (StringTree *)0x240547;
      if (builder_1.pos != (RemoveConst<kj::StringTree> *)0x0) {
        local_1f8 = builder_1.ptr;
      }
      pSStack_1f0 = (StringTree *)
                    ((long)&(builder_1.pos)->size_ +
                    (ulong)(builder_1.pos == (RemoveConst<kj::StringTree> *)0x0));
      BrandInitializerText::BrandInitializerText
                ((BrandInitializerText *)local_640,(BrandInitializerText *)&annotatedName_1);
      hexId_00.content.size_ = (size_t)pSStack_1f0;
      hexId_00.content.ptr = (char *)local_1f8;
      fullName_00.content.size_ = (size_t)local_640;
      fullName_00.content.ptr = (char *)(sVar2 + (sVar2 == 0));
      pSVar13 = pSStack_1f0;
      makeGenericDefinitions
                ((StringTree *)&builder_4,(CapnpcCppMain *)schema.raw,pTVar16,fullName_00,hexId_00,
                 (BrandInitializerText *)pcVar20);
      kj::StringTree::concat<kj::StringTree,kj::StringTree>
                (&whichName.name,&defineText,(StringTree *)&builder_4,pSVar13);
      kj::StringTree::operator=(&defineText,&whichName.name);
      kj::StringTree::~StringTree(&whichName.name);
      kj::StringTree::~StringTree((StringTree *)&builder_4);
      BrandInitializerText::~BrandInitializerText((BrandInitializerText *)local_640);
      kj::Array<char>::~Array((Array<char> *)&builder_1);
      BrandInitializerText::~BrandInitializerText((BrandInitializerText *)&annotatedName_1);
    }
    kj::strTree<kj::StringTree,char_const(&)[5]>
              ((StringTree *)&annotatedName_1,(kj *)&declareText,(StringTree *)"  };",
               (char (*) [5])pSVar13);
    kj::StringTree::operator=(&declareText,(StringTree *)&annotatedName_1);
    kj::StringTree::~StringTree((StringTree *)&annotatedName_1);
    kj::strTree<kj::StringTree,char_const(&)[25]>
              ((StringTree *)&annotatedName_1,(kj *)&defineText,(StringTree *)0x2407ba,
               (char (*) [25])pSVar13);
    kj::StringTree::operator=(&defineText,(StringTree *)&annotatedName_1);
    kj::StringTree::~StringTree((StringTree *)&annotatedName_1);
    whichName.name.branches.disposer._0_4_ = 0;
    whichName.name.branches.disposer._4_4_ = 0;
    whichName.isArgDependent = false;
    whichName.needsTypename = false;
    whichName.hasInterfaces_ = false;
    whichName.hasDisambiguatedTemplate_ = false;
    whichName.name.branches.ptr = (Branch *)0x0;
    whichName.name.branches.size_._0_4_ = 0;
    whichName.name.branches.size_._4_4_ = 0;
    whichName.name.text.content.size_ = 0;
    whichName.name.text.content.disposer = (ArrayDisposer *)0x0;
    whichName.name.size_ = 0;
    whichName.name.text.content.ptr = (char *)0x0;
    if ((0xff < structNode._reader.dataSize) &&
       (*(short *)((long)structNode._reader.data + 0x1e) != 0)) {
      annotatedName_1.isSet = false;
      cppFullName((CppTypeName *)&builder_4,this,local_840,
                  (Maybe<capnp::InterfaceSchema::Method> *)&annotatedName_1);
      CppTypeName::operator=(&whichName,(CppTypeName *)&builder_4);
      kj::StringTree::~StringTree((StringTree *)&builder_4);
      innerName.content.size_ = 6;
      innerName.content.ptr = "Which";
      CppTypeName::addMemberType(&whichName,innerName);
    }
    bVar3 = TemplateContext::hasParams((TemplateContext *)schema.raw);
    local_450 = "";
    if (bVar3) {
      local_450 = "  ";
    }
    suffix_00.content.size_ = 1;
    suffix_00.content.ptr = "";
    TemplateContext::decl((StringTree *)&upperCase,(TemplateContext *)schema.raw,true,suffix_00);
    kj::strTree<char_const*,kj::StringTree,char_const(&)[10],kj::StringPtr&,char_const(&)[3]>
              ((StringTree *)&annotatedName,(kj *)&local_450,(char **)&upperCase,
               (StringTree *)"  struct ",(char (*) [10])&local_908,(StringPtr *)0x24115c,
               (char (*) [3])in_stack_fffffffffffff5f8);
    TemplateContext::parentDecls((StringTree *)&constType,(TemplateContext *)schema.raw);
    params_2_00 = (char (*) [6])0x1;
    local_910 = "";
    suffix_01.content.size_ = 1;
    suffix_01.content.ptr = "";
    TemplateContext::decl
              ((StringTree *)&local_6f0,(TemplateContext *)schema.raw,local_648 < (char *)0x2,
               suffix_01);
    if ((structNode._reader.dataSize < 0x100) ||
       (*(short *)((long)structNode._reader.data + 0x1e) == 0)) {
      kj::StringTree::concat<>();
      bVar3 = false;
    }
    else {
      capnp::schema::Node::Struct::Reader::getFields((Reader *)local_88,&structNode);
      local_158._32_8_ = local_68;
      local_158._40_8_ = sStack_60;
      local_158._16_8_ = local_88._16_8_;
      local_158._24_8_ = local_88._24_8_;
      local_158._0_8_ = local_88._0_8_;
      local_158._8_8_ = local_88._8_8_;
      builder.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>
                              (local_88._24_8_ & 0xffffffff);
      pSVar13 = builder.ptr + (local_88._24_8_ & 0xffffffff);
      builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      local_558.ptr = (char *)local_158;
      iVar22 = 0;
      builder.endPtr = pSVar13;
      builder.pos = builder.ptr;
      while( true ) {
        local_558.size_._0_4_ = iVar22;
        if (iVar22 == local_158._24_4_) break;
        pCVar18 = (CapnpcCppMain *)&builder_1;
        _::
        IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
        ::operator*((Reader *)&builder_1,
                    (IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                     *)&local_558);
        if ((local_9c8 < 0x20) || (*(short *)((long)&(builder_1.endPtr)->size_ + 2) == 0)) {
          kj::StringTree::concat<>();
        }
        else {
          proto_03._reader._36_4_ = uStack_9c4;
          proto_03._reader.dataSize = local_9c8;
          proto_03._reader.capTable = (CapTableReader *)builder_1.pos;
          proto_03._reader.segment = (SegmentReader *)builder_1.ptr;
          proto_03._reader.data = builder_1.endPtr;
          proto_03._reader.pointers = (WirePointer *)builder_1.disposer;
          proto_03._reader._40_8_ = pIStack_9c0;
          SVar27 = protoName<capnp::schema::Field::Reader>(pCVar18,proto_03);
          name_01.content.ptr = (char *)SVar27.content.size_;
          name_01.content.size_ = (size_t)pSVar13;
          toUpperCase((String *)&local_448,(CapnpcCppMain *)SVar27.content.ptr,name_01);
          pSVar13 = (StringTree *)0x2412f0;
          kj::strTree<char_const(&)[5],kj::String,char_const(&)[3]>
                    ((StringTree *)&builder_4,(kj *)0x251b9c,(char (*) [5])&local_448,
                     (String *)0x2412f0,(char (*) [3])params_2_00);
          kj::Array<char>::~Array((Array<char> *)&local_448);
        }
        kj::StringTree::StringTree(builder.pos,(StringTree *)&builder_4);
        builder.pos = builder.pos + 1;
        kj::StringTree::~StringTree((StringTree *)&builder_4);
        iVar22 = (uint)local_558.size_ + 1;
      }
      local_4b8._32_8_ = ((long)builder.pos - (long)builder.ptr) / 0x38;
      local_4b8._24_8_ = builder.ptr;
      local_4b8._40_8_ = builder.disposer;
      builder._0_16_ = ZEXT816(0);
      builder.endPtr = (StringTree *)0x0;
      kj::ArrayBuilder<kj::StringTree>::dispose(&builder);
      bVar3 = true;
      kj::strTree<char_const(&)[26],kj::Array<kj::StringTree>,char_const(&)[6]>
                (&local_488,(kj *)"  enum Which: uint16_t {\n",(char (*) [26])(local_4b8 + 0x18),
                 (Array<kj::StringTree> *)"  };\n",params_2_00);
    }
    local_4b8._0_8_ =
         kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>(local_708.size_);
    pSVar13 = local_708.ptr;
    builder_1.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    for (lVar8 = 0; pSVar10 = (StringTree *)((long)&pSVar13->size_ + lVar8),
        pSVar10 != local_708.ptr + local_708.size_; lVar8 = lVar8 + 0x38) {
      kj::StringTree::StringTree((StringTree *)&builder_4,pSVar10);
      kj::StringTree::StringTree
                ((StringTree *)((long)&((StringTree *)local_4b8._0_8_)->size_ + lVar8),
                 (StringTree *)&builder_4);
      builder_1.pos =
           (RemoveConst<kj::StringTree> *)
           ((long)&((StringTree *)(local_4b8._0_8_ + 0x38))->size_ + lVar8);
      kj::StringTree::~StringTree((StringTree *)&builder_4);
    }
    local_4b8._8_8_ = lVar8 / 0x38;
    local_4b8._16_8_ = &kj::_::HeapArrayDisposer::instance;
    builder_1.ptr = (StringTree *)0x0;
    builder_1.pos = (RemoveConst<kj::StringTree> *)0x0;
    builder_1.endPtr = (StringTree *)0x0;
    kj::ArrayBuilder<kj::StringTree>::dispose(&builder_1);
    kj::
    strTree<kj::StringTree,kj::StringTree,char_const(&)[8],kj::StringPtr&,kj::StringPtr&,char_const(&)[4],char_const(&)[3],kj::StringPtr&,char_const(&)[66],kj::StringTree,kj::Array<kj::StringTree>,char_const(&)[2],kj::StringTree,char_const(&)[2],char_const(&)[5]>
              ((StringTree *)local_2e0,(kj *)&constType,(StringTree *)&local_6f0,
               (StringTree *)0x2403ce,(char (*) [8])&local_650,(StringPtr *)&local_908,
               (StringPtr *)0x240ef8,(char (*) [4])0x23fc44,(char (*) [3])&local_908,
               (StringPtr *)"() = delete;\n\n  class Reader;\n  class Builder;\n  class Pipeline;\n"
               ,(char (*) [66])&local_488,(StringTree *)local_4b8,(Array<kj::StringTree> *)0x240546,
               (char (*) [2])&declareText,(StringTree *)0x240546,(char (*) [2])0x241937,
               (char (*) [5])in_stack_fffffffffffff5f8);
    if (fullName.content.size_ != 0) {
      local_910 = fullName.content.ptr;
    }
    local_510 = (char *)(fullName.content.size_ + (fullName.content.size_ == 0));
    bVar25 = true;
    if (0xff < structNode._reader.dataSize) {
      bVar25 = *(short *)((long)structNode._reader.data + 0x1e) == 0;
    }
    local_518 = (TemplateContext *)local_908.ptr;
    local_520.scopeId = local_908.size_;
    local_4e8._24_8_ = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>(sVar9);
    builder_1.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    lVar24 = 0;
    pFVar15 = pFVar7;
    for (lVar8 = local_508; lVar8 != 0; lVar8 = lVar8 + -0xe0) {
      kj::StringTree::StringTree((StringTree *)&builder_4,&pFVar15->readerMethodDecls);
      kj::StringTree::StringTree
                ((StringTree *)((long)&((StringTree *)local_4e8._24_8_)->size_ + lVar24),
                 (StringTree *)&builder_4);
      builder_1.pos =
           (RemoveConst<kj::StringTree> *)
           ((long)&((StringTree *)(local_4e8._24_8_ + 0x38))->size_ + lVar24);
      kj::StringTree::~StringTree((StringTree *)&builder_4);
      pFVar15 = pFVar15 + 1;
      lVar24 = lVar24 + 0x38;
    }
    local_4c8 = (Branch *)(lVar24 / 0x38);
    local_4c0 = &kj::_::HeapArrayDisposer::instance;
    builder_1.ptr = (StringTree *)0x0;
    builder_1.pos = (RemoveConst<kj::StringTree> *)0x0;
    builder_1.endPtr = (StringTree *)0x0;
    kj::ArrayBuilder<kj::StringTree>::dispose(&builder_1);
    pTVar16 = local_518;
    aVar21 = local_520;
    local_808.size_ = (size_t)local_910;
    local_808.text.content.ptr = local_510;
    type.field_4.schema = local_520.schema;
    type._0_8_ = local_518;
    TemplateContext::allDecls((StringTree *)&builder_4,(TemplateContext *)schema.raw);
    local_558 = (ArrayPtr<const_char>)ZEXT816(0);
    local_548 = 0;
    type_00.content.size_ = (size_t)&local_558;
    type_00.content.ptr = (char *)aVar21.schema;
    makeAsGenericDef((StringTree *)&builder_1,(CapnpcCppMain *)0x0,(AsGenericRole)schema.raw,pTVar16
                     ,type_00,(String *)in_stack_fffffffffffff5f8);
    if (bVar25) {
      params_9 = (char (*) [348])0x1866f4;
      kj::StringTree::concat<>();
    }
    else {
      params_9 = (char (*) [348])0x186707;
      kj::strTree<char_const(&)[31]>
                ((StringTree *)&builder,(kj *)"  inline Which which() const;\n",params_01);
    }
    kj::
    strTree<kj::StringTree,char_const(&)[7],kj::StringPtr&,char_const(&)[30],kj::StringPtr&,char_const(&)[365],kj::StringTree,kj::StringTree,kj::Array<kj::StringTree>,char_const(&)[348]>
              (&local_448,(kj *)&builder_4,(StringTree *)0x2401d4,(char (*) [7])&local_808,
               (StringPtr *)"::Reader {\npublic:\n  typedef ",(char (*) [30])&type,
               (StringPtr *)
               " Reads;\n\n  Reader() = default;\n  inline explicit Reader(::capnp::_::StructReader base): _reader(base) {}\n\n  inline ::capnp::MessageSize totalSize() const {\n    return _reader.totalSize().asPublic();\n  }\n\n#if !CAPNP_LITE\n  inline ::kj::StringTree toString() const {\n    return ::capnp::_::structString(_reader, *_capnpPrivate::brand());\n  }\n#endif  // !CAPNP_LITE\n\n"
               ,(char (*) [365])&builder_1,(StringTree *)&builder,(StringTree *)(local_4e8 + 0x18),
               (Array<kj::StringTree> *)
               "private:\n  ::capnp::_::StructReader _reader;\n  template <typename, ::capnp::Kind>\n  friend struct ::capnp::ToDynamic_;\n  template <typename, ::capnp::Kind>\n  friend struct ::capnp::_::PointerHelpers;\n  template <typename, ::capnp::Kind>\n  friend struct ::capnp::List;\n  friend class ::capnp::MessageBuilder;\n  friend class ::capnp::Orphanage;\n};\n\n"
               ,params_9);
    kj::StringTree::~StringTree((StringTree *)&builder);
    kj::StringTree::~StringTree((StringTree *)&builder_1);
    kj::Array<char>::~Array((Array<char> *)&local_558);
    kj::StringTree::~StringTree((StringTree *)&builder_4);
    pcVar20 = fullName.content.ptr;
    if (fullName.content.size_ == 0) {
      pcVar20 = "";
    }
    aVar21.schema = (RawBrandedSchema *)(fullName.content.size_ + (fullName.content.size_ == 0));
    bVar25 = true;
    if (0xff < structNode._reader.dataSize) {
      bVar25 = *(short *)((long)structNode._reader.data + 0x1e) == 0;
    }
    pcVar12 = local_908.ptr;
    sVar2 = local_908.size_;
    pSVar13 = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>(sVar9);
    builder_1.endPtr = pSVar13 + sVar9;
    builder_1.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    pFVar15 = pFVar7;
    builder_1.ptr = pSVar13;
    builder_1.pos = pSVar13;
    for (; pFVar7 != pFVar15 + sVar9; pFVar7 = pFVar7 + 1) {
      kj::StringTree::StringTree((StringTree *)&builder_4,&pFVar7->builderMethodDecls);
      pRVar23 = builder_1.pos;
      kj::StringTree::StringTree(builder_1.pos,(StringTree *)&builder_4);
      pSVar13 = pRVar23 + 1;
      builder_1.pos = pSVar13;
      kj::StringTree::~StringTree((StringTree *)&builder_4);
      pFVar15 = fieldTexts.ptr;
      sVar9 = fieldTexts.size_;
    }
    local_4e8._8_8_ = ((long)pSVar13 - (long)builder_1.ptr) / 0x38;
    local_4e8._0_8_ = builder_1.ptr;
    local_4e8._16_8_ = builder_1.disposer;
    builder_1.ptr = (StringTree *)0x0;
    builder_1.pos = (RemoveConst<kj::StringTree> *)0x0;
    builder_1.endPtr = (StringTree *)0x0;
    kj::ArrayBuilder<kj::StringTree>::dispose(&builder_1);
    type.field_4.schema = aVar21.schema;
    type._0_8_ = pcVar20;
    builder_3.ptr = (StringTree *)pcVar12;
    builder_3.pos = (RemoveConst<kj::StringTree> *)sVar2;
    TemplateContext::allDecls((StringTree *)&builder_4,(TemplateContext *)schema.raw);
    local_808.size_ = 0;
    local_808.text.content.ptr = (char *)0x0;
    local_808.text.content.size_ = 0;
    type_01.content.size_ = (size_t)&local_808;
    type_01.content.ptr = (char *)sVar2;
    makeAsGenericDef((StringTree *)&builder_1,(CapnpcCppMain *)0x1,(AsGenericRole)schema.raw,
                     (TemplateContext *)pcVar12,type_01,(String *)in_stack_fffffffffffff5f8);
    if (bVar25) {
      kj::StringTree::concat<>();
    }
    else {
      kj::strTree<char_const(&)[25]>
                ((StringTree *)&builder,(kj *)"  inline Which which();\n",params_02);
    }
    kj::
    strTree<kj::StringTree,char_const(&)[7],kj::StringPtr&,char_const(&)[31],kj::StringPtr&,char_const(&)[593],kj::StringTree,kj::StringTree,kj::Array<kj::StringTree>,char_const(&)[157],char_const(&)[86]>
              ((StringTree *)&local_558,(kj *)&builder_4,(StringTree *)0x2401d4,(char (*) [7])&type,
               (StringPtr *)"::Builder {\npublic:\n  typedef ",(char (*) [31])&builder_3,
               (StringPtr *)
               " Builds;\n\n  Builder() = delete;  // Deleted to discourage incorrect usage.\n                       // You can explicitly initialize to nullptr instead.\n  inline Builder(decltype(nullptr)) {}\n  inline explicit Builder(::capnp::_::StructBuilder base): _builder(base) {}\n  inline operator Reader() const { return Reader(_builder.asReader()); }\n  inline Reader asReader() const { return *this; }\n\n  inline ::capnp::MessageSize totalSize() const { return asReader().totalSize(); }\n#if !CAPNP_LITE\n  inline ::kj::StringTree toString() const { return asReader().toString(); }\n#endif  // !CAPNP_LITE\n\n"
               ,(char (*) [593])&builder_1,(StringTree *)&builder,(StringTree *)local_4e8,
               (Array<kj::StringTree> *)
               "private:\n  ::capnp::_::StructBuilder _builder;\n  template <typename, ::capnp::Kind>\n  friend struct ::capnp::ToDynamic_;\n  friend class ::capnp::Orphanage;\n"
               ,(char (*) [157])
                "  template <typename, ::capnp::Kind>\n  friend struct ::capnp::_::PointerHelpers;\n};\n\n"
               ,(char (*) [86])in_stack_fffffffffffff5f8);
    kj::StringTree::~StringTree((StringTree *)&builder);
    kj::StringTree::~StringTree((StringTree *)&builder_1);
    kj::Array<char>::~Array((Array<char> *)&local_808);
    kj::StringTree::~StringTree((StringTree *)&builder_4);
    pSVar13 = (StringTree *)fullName.content.ptr;
    if (fullName.content.size_ == 0) {
      pSVar13 = (StringTree *)0x240547;
    }
    pRVar23 = (RemoveConst<kj::StringTree> *)
              (fullName.content.size_ + (fullName.content.size_ == 0));
    pcVar20 = local_908.ptr;
    sVar2 = local_908.size_;
    pSVar10 = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>(sVar9);
    builder.endPtr = pSVar10 + sVar9;
    builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    pFVar7 = pFVar15;
    builder.ptr = pSVar10;
    builder.pos = pSVar10;
    for (; pFVar15 != pFVar7 + sVar9; pFVar15 = pFVar15 + 1) {
      kj::StringTree::StringTree((StringTree *)&builder_4,&pFVar15->pipelineMethodDecls);
      pRVar1 = builder.pos;
      kj::StringTree::StringTree(builder.pos,(StringTree *)&builder_4);
      pSVar10 = pRVar1 + 1;
      builder.pos = pSVar10;
      kj::StringTree::~StringTree((StringTree *)&builder_4);
      pFVar7 = fieldTexts.ptr;
      sVar9 = fieldTexts.size_;
    }
    local_500.size_ = ((long)pSVar10 - (long)builder.ptr) / 0x38;
    local_500.ptr = builder.ptr;
    local_500.disposer = builder.disposer;
    builder._0_16_ = ZEXT816(0);
    builder.endPtr = (StringTree *)0x0;
    kj::ArrayBuilder<kj::StringTree>::dispose(&builder);
    builder.pos = pRVar23;
    builder.ptr = pSVar13;
    local_808.size_ = (size_t)pcVar20;
    local_808.text.content.ptr = (char *)sVar2;
    TemplateContext::allDecls((StringTree *)&builder_4,(TemplateContext *)schema.raw);
    pSVar13 = (StringTree *)&builder;
    kj::
    strTree<char_const(&)[17],kj::StringTree,char_const(&)[7],kj::StringPtr&,char_const(&)[32],kj::StringPtr&,char_const(&)[183],kj::Array<kj::StringTree>,char_const(&)[192]>
              ((StringTree *)&builder_1,(kj *)0x23fcc4,(char (*) [17])&builder_4,
               (StringTree *)0x2401d4,(char (*) [7])pSVar13,
               (StringPtr *)"::Pipeline {\npublic:\n  typedef ",(char (*) [32])&local_808,
               (StringPtr *)
               " Pipelines;\n\n  inline Pipeline(decltype(nullptr)): _typeless(nullptr) {}\n  inline explicit Pipeline(::capnp::AnyPointer::Pipeline&& typeless)\n      : _typeless(kj::mv(typeless)) {}\n\n"
               ,(char (*) [183])&local_500,
               (Array<kj::StringTree> *)
               "private:\n  ::capnp::AnyPointer::Pipeline _typeless;\n  friend class ::capnp::PipelineHook;\n  template <typename, ::capnp::Kind>\n  friend struct ::capnp::ToDynamic_;\n};\n#endif  // !CAPNP_LITE\n\n"
               ,(char (*) [192])in_stack_fffffffffffff5f8);
    kj::StringTree::~StringTree((StringTree *)&builder_4);
    kj::StringTree::concat<kj::StringTree,kj::StringTree,kj::StringTree>
              (&local_2a8,&local_448,(StringTree *)&local_558,(StringTree *)&builder_1,pSVar13);
    if ((structNode._reader.dataSize < 0x100) ||
       (*(short *)((long)structNode._reader.data + 0x1e) == 0)) {
      kj::StringTree::concat<>();
      bVar25 = false;
    }
    else {
      TemplateContext::allDecls(&local_808,(TemplateContext *)schema.raw);
      TemplateContext::allDecls((StringTree *)&type,(TemplateContext *)schema.raw);
      local_168 = kj::toCharSequence<char_const(&)[8]>((char (*) [8])0x242570);
      kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                ((String *)&builder_4,(kj *)&whichName,(CppTypeName *)local_168.size_);
      local_178 = kj::toCharSequence<char_const(&)[2]>((char (*) [2])0x23fc45);
      local_188.size_ = 0;
      if (fullName.content.size_ != 0) {
        local_188.size_ = fullName.content.size_ - 1;
      }
      local_198 = kj::toCharSequence<char_const(&)[88]>
                            ((char (*) [88])
                             "::Reader::which() const {\n  return _reader.getDataField<Which>(\n      ::capnp::bounded<"
                            );
      kj::toCharSequence<unsigned_int&>
                ((CappedArray<char,_14UL> *)&builder_3,(kj *)&discrimOffset,(uint *)local_198.size_)
      ;
      local_1a8 = kj::toCharSequence<char_const(&)[29]>
                            ((char (*) [29])">() * ::capnp::ELEMENTS);\n}\n");
      local_1b8 = kj::toCharSequence<char_const(&)[8]>((char (*) [8])0x242570);
      kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                ((String *)local_7b0,(kj *)&whichName,(CppTypeName *)local_1b8.size_);
      local_1c8 = kj::toCharSequence<char_const(&)[2]>((char (*) [2])0x23fc45);
      local_1d8.size_ = 0;
      if (fullName.content.size_ != 0) {
        local_1d8.size_ = fullName.content.size_ - 1;
      }
      local_1e8 = kj::toCharSequence<char_const(&)[84]>
                            ((char (*) [84])
                             "::Builder::which() {\n  return _builder.getDataField<Which>(\n      ::capnp::bounded<"
                            );
      kj::toCharSequence<unsigned_int&>(&local_48,(kj *)&discrimOffset,(uint *)local_1e8.size_);
      pAVar31 = (ArrayPtr<const_char> *)0x186dc4;
      local_58 = kj::toCharSequence<char_const(&)[30]>
                           ((char (*) [30])">() * ::capnp::ELEMENTS);\n}\n\n");
      kj::StringTree::
      concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
                ((StringTree *)&builder,&local_808,(StringTree *)&local_168,
                 (ArrayPtr<const_char> *)&builder_4,(String *)&local_178,&local_188,&local_198,
                 (ArrayPtr<const_char> *)&builder_3,(CappedArray<char,_14UL> *)&local_1a8,
                 (ArrayPtr<const_char> *)&type,(StringTree *)&local_1b8,
                 (ArrayPtr<const_char> *)local_7b0,(String *)&local_1c8,&local_1d8,&local_1e8,
                 (ArrayPtr<const_char> *)&local_48,(CappedArray<char,_14UL> *)&local_58,pAVar31);
      kj::Array<char>::~Array((Array<char> *)local_7b0);
      kj::Array<char>::~Array((Array<char> *)&builder_4);
      bVar25 = true;
    }
    pSVar13 = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>(sVar9);
    builder_3.endPtr = pSVar13 + sVar9;
    builder_3.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    pFVar15 = pFVar7;
    builder_3.ptr = pSVar13;
    builder_3.pos = pSVar13;
    for (; pSVar10 = builder_3.ptr, pFVar7 != pFVar15 + sVar9; pFVar7 = pFVar7 + 1) {
      kj::StringTree::StringTree((StringTree *)&builder_4,&pFVar7->inlineMethodDefs);
      pRVar23 = builder_3.pos;
      kj::StringTree::StringTree(builder_3.pos,(StringTree *)&builder_4);
      pSVar13 = pRVar23 + 1;
      builder_3.pos = pSVar13;
      kj::StringTree::~StringTree((StringTree *)&builder_4);
      pFVar15 = fieldTexts.ptr;
      sVar9 = fieldTexts.size_;
    }
    local_7b0._8_8_ = ((long)pSVar13 - (long)builder_3.ptr) / 0x38;
    local_7b0._0_8_ = builder_3.ptr;
    local_7b0._16_8_ = builder_3.disposer;
    builder_3.ptr = (StringTree *)0x0;
    builder_3.pos = (RemoveConst<kj::StringTree> *)0x0;
    builder_3.endPtr = (StringTree *)0x0;
    kj::ArrayBuilder<kj::StringTree>::dispose(&builder_3);
    kj::strTree<kj::StringTree,kj::Array<kj::StringTree>>
              (&local_270,(kj *)&builder,(StringTree *)local_7b0,(Array<kj::StringTree> *)pSVar10);
    local_238.size_ = defineText.size_;
    local_238.text.content.ptr = defineText.text.content.ptr;
    local_238.text.content.size_ = defineText.text.content.size_;
    defineText.text.content.ptr = (char *)0x0;
    defineText.text.content.size_ = 0;
    local_238.text.content.disposer = defineText.text.content.disposer;
    local_238.branches.ptr = defineText.branches.ptr;
    local_238.branches.size_ = defineText.branches.size_;
    local_238.branches.disposer = defineText.branches.disposer;
    defineText.branches.ptr = (Branch *)0x0;
    defineText.branches.size_ = 0;
    kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)local_7b0);
    kj::StringTree::~StringTree((StringTree *)&builder);
    if (bVar25) {
      kj::StringTree::~StringTree((StringTree *)&type);
      kj::StringTree::~StringTree(&local_808);
    }
    kj::StringTree::~StringTree((StringTree *)&builder_1);
    kj::Array<kj::StringTree>::~Array(&local_500);
    kj::StringTree::~StringTree((StringTree *)&local_558);
    kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)local_4e8);
    kj::StringTree::~StringTree(&local_448);
    kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)(local_4e8 + 0x18));
    kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)local_4b8);
    kj::StringTree::~StringTree(&local_488);
    if (bVar3) {
      kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)(local_4b8 + 0x18));
    }
    kj::StringTree::~StringTree((StringTree *)&local_6f0);
    kj::StringTree::~StringTree((StringTree *)&constType);
    kj::StringTree::~StringTree((StringTree *)&upperCase);
    kj::StringTree::~StringTree(&whichName.name);
    kj::StringTree::~StringTree(&defineText);
    kj::StringTree::~StringTree(&declareText);
    kj::Array<char>::~Array(&templates.content);
    kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText>::~Array(&fieldTexts);
    kj::Array<char>::~Array(&subScope.content);
    kj::Array<char>::~Array(&fullName.content);
    kj::Array<kj::StringTree>::~Array(&local_708);
    kj::StringTree::StringTree(&__return_storage_ptr__->outerTypeDecl,(StringTree *)&annotatedName);
    kj::StringTree::StringTree(&__return_storage_ptr__->outerTypeDef,(StringTree *)local_2e0);
    kj::StringTree::StringTree(&__return_storage_ptr__->readerBuilderDefs,&local_2a8);
    kj::StringTree::StringTree(&__return_storage_ptr__->inlineMethodDefs,&local_270);
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::StringTree(&__return_storage_ptr__->sourceFileDefs,&local_238);
    StructText::~StructText((StructText *)&annotatedName);
    break;
  case 2:
    annotatedName._0_8_ = Schema::asEnum(&schema_local);
    EnumSchema::getEnumerants((EnumerantList *)&whichName,(EnumSchema *)&annotatedName);
    if (pcVar20 == (char *)0x1) {
      kj::StringTree::concat<>();
      params_2 = &hexId;
      kj::
      strTree<char_const(&)[27],kj::StringPtr&,char_const(&)[2],kj::CappedArray<char,17ul>&,char_const(&)[2],kj::StringPtr&,char_const(&)[4]>
                (&__return_storage_ptr__->outerTypeDef,(kj *)0x2401b4,(char (*) [27])&name,
                 (StringPtr *)0x23fdb0,(char (*) [2])params_2,(CappedArray<char,_17UL> *)0x23fc45,
                 (char (*) [2])&name,(StringPtr *)0x240544,(char (*) [4])in_stack_fffffffffffff5f8);
    }
    else {
      params_2 = &hexId;
      kj::
      strTree<char_const(&)[29],kj::StringPtr&,char_const(&)[2],kj::CappedArray<char,17ul>&,char_const(&)[2],kj::StringPtr&,char_const(&)[4]>
                (&__return_storage_ptr__->outerTypeDecl,(kj *)"  typedef ::capnp::schemas::",
                 (char (*) [29])&name,(StringPtr *)0x23fdb0,(char (*) [2])params_2,
                 (CappedArray<char,_17UL> *)0x23fc45,(char (*) [2])&name,(StringPtr *)0x240544,
                 (char (*) [4])in_stack_fffffffffffff5f8);
      kj::StringTree::concat<>();
    }
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    count = (ulong)whichName.name.branches.ptr & 0xffffffff;
    builder_4.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>(count);
    pSVar13 = builder_4.ptr + count;
    builder_4.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    builder_4.pos = builder_4.ptr;
    builder_4.endPtr = pSVar13;
    declareText.size_ = (size_t)&whichName;
    for (declareText.text.content.ptr._0_4_ = 0;
        (int)declareText.text.content.ptr != (int)whichName.name.branches.ptr;
        declareText.text.content.ptr._0_4_ = (int)declareText.text.content.ptr + 1) {
      pCVar18 = (CapnpcCppMain *)&annotatedName_1;
      _::IndexingIterator<const_capnp::EnumSchema::EnumerantList,_capnp::EnumSchema::Enumerant>::
      operator*((Enumerant *)&annotatedName_1,
                (IndexingIterator<const_capnp::EnumSchema::EnumerantList,_capnp::EnumSchema::Enumerant>
                 *)&declareText);
      annotatedName._1_1_ = annotatedName_1._1_1_;
      annotatedName.isSet = annotatedName_1.isSet;
      annotatedName._2_6_ = annotatedName_1._2_6_;
      annotatedName.field_1._40_8_ = annotatedName_1.field_1._40_8_;
      local_2e0._0_8_ = local_3c0.size_;
      annotatedName.field_1.value._reader.pointers = annotatedName_1.field_1.value._reader.pointers;
      annotatedName.field_1._32_8_ = annotatedName_1.field_1._32_8_;
      annotatedName.field_1.value._reader.capTable = annotatedName_1.field_1.value._reader.capTable;
      annotatedName.field_1.value._reader.data = annotatedName_1.field_1.value._reader.data;
      annotatedName.field_1.value._reader.segment = annotatedName_1.field_1.value._reader.segment;
      proto_02._reader.capTable = (CapTableReader *)annotatedName_1.field_1.value._reader.data;
      proto_02._reader.segment = (SegmentReader *)annotatedName_1.field_1.value._reader.capTable;
      proto_02._reader.data = annotatedName_1.field_1.value._reader.pointers;
      proto_02._reader.pointers = (WirePointer *)annotatedName_1.field_1._32_8_;
      proto_02._reader.dataSize = annotatedName_1.field_1._40_4_;
      proto_02._reader.pointerCount = annotatedName_1.field_1._44_2_;
      proto_02._reader._38_2_ = annotatedName_1.field_1._46_2_;
      proto_02._reader._40_8_ = local_3c0.size_;
      SVar27 = protoName<capnp::schema::Enumerant::Reader>(pCVar18,proto_02);
      name_00.content.ptr = (char *)SVar27.content.size_;
      name_00.content.size_ = (size_t)pSVar13;
      toUpperCase((String *)&builder_1,(CapnpcCppMain *)SVar27.content.ptr,name_00);
      pSVar13 = (StringTree *)0x2412f0;
      kj::strTree<char_const(&)[3],kj::String,char_const(&)[3]>
                ((StringTree *)local_640,(kj *)0x23fc44,(char (*) [3])&builder_1,(String *)0x2412f0,
                 (char (*) [3])params_2);
      kj::Array<char>::~Array((Array<char> *)&builder_1);
      kj::StringTree::StringTree(builder_4.pos,(StringTree *)local_640);
      builder_4.pos = builder_4.pos + 1;
      kj::StringTree::~StringTree((StringTree *)local_640);
    }
    builder.pos = (RemoveConst<kj::StringTree> *)
                  (((long)builder_4.pos - (long)builder_4.ptr) / 0x38);
    builder.ptr = builder_4.ptr;
    builder.endPtr = (StringTree *)builder_4.disposer;
    builder_4.ptr = (StringTree *)0x0;
    builder_4.pos = (RemoveConst<kj::StringTree> *)0x0;
    builder_4.endPtr = (StringTree *)0x0;
    kj::ArrayBuilder<kj::StringTree>::dispose(&builder_4);
    kj::
    strTree<char_const(&)[12],kj::StringPtr&,char_const(&)[2],kj::CappedArray<char,17ul>&,char_const(&)[14],kj::Array<kj::StringTree>,char_const(&)[23],kj::StringPtr&,char_const(&)[3],kj::CappedArray<char,17ul>&,char_const(&)[4]>
              (&__return_storage_ptr__->capnpSchemaDecls,(kj *)"enum class ",(char (*) [12])&name,
               (StringPtr *)0x23fdb0,(char (*) [2])&hexId,(CappedArray<char,_17UL> *)0x240424,
               (char (*) [14])&builder,(Array<kj::StringTree> *)"};\nCAPNP_DECLARE_ENUM(",
               (char (*) [23])&name,(StringPtr *)0x241176,(char (*) [3])&hexId,
               (CappedArray<char,_17UL> *)0x24115b,(char (*) [4])in_stack_fffffffffffff5f8);
    kj::
    strTree<char_const(&)[19],kj::StringPtr&,char_const(&)[2],kj::CappedArray<char,17ul>&,char_const(&)[3],kj::CappedArray<char,17ul>&,char_const(&)[4]>
              (&__return_storage_ptr__->capnpSchemaDefs,(kj *)"CAPNP_DEFINE_ENUM(",
               (char (*) [19])&name,(StringPtr *)0x23fdb0,(char (*) [2])&hexId,
               (CappedArray<char,_17UL> *)0x241176,(char (*) [3])&hexId,
               (CappedArray<char,_17UL> *)0x24115b,(char (*) [4])in_stack_fffffffffffff5f8);
    kj::StringTree::concat<>();
    kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)&builder);
    break;
  case 3:
    this->hasInterfaces = true;
    pAVar30 = (ArrayDisposer *)0x185748;
    schema_00 = Schema::asInterface(&schema_local);
    local_158._48_8_ = *plVar19;
    local_120 = plVar19[1];
    local_118 = plVar19[2];
    *plVar19 = 0;
    plVar19[1] = 0;
    nestedTypeDecls_00.size_ = (size_t)schema.raw;
    nestedTypeDecls_00.ptr = (StringTree *)(local_158 + 0x30);
    nestedTypeDecls_00.disposer = pAVar30;
    makeInterfaceText((InterfaceText *)&annotatedName,this,namespace_,SVar27,schema_00,
                      nestedTypeDecls_00,in_stack_fffffffffffff5f8);
    kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)(local_158 + 0x30));
    kj::StringTree::StringTree(&__return_storage_ptr__->outerTypeDecl,(StringTree *)&annotatedName);
    kj::StringTree::StringTree(&__return_storage_ptr__->outerTypeDef,(StringTree *)local_2e0);
    kj::StringTree::StringTree(&__return_storage_ptr__->readerBuilderDefs,&local_2a8);
    kj::StringTree::StringTree(&__return_storage_ptr__->inlineMethodDefs,&local_270);
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::StringTree(&__return_storage_ptr__->sourceFileDefs,&local_238);
    InterfaceText::~InterfaceText((InterfaceText *)&annotatedName);
    break;
  case 4:
    proto_1._reader.segment = (SegmentReader *)Schema::asConst(&schema_local);
    local_808.size_ = (size_t)namespace_.content.ptr;
    local_808.text.content.ptr = pcVar20;
    Schema::getProto((Reader *)&declareText,(Schema *)&proto_1);
    defineText.branches.size_ = declareText.branches.size_;
    defineText.text.content.size_ = declareText.text.content.size_;
    defineText.text.content.disposer = declareText.text.content.disposer;
    defineText.size_ = declareText.size_;
    type = ConstSchema::getType((ConstSchema *)&proto_1);
    aVar21 = type.field_4;
    pNVar11 = &annotatedName_1;
    annotatedName_1.isSet = false;
    typeName(&whichName,this,type,(Maybe<capnp::InterfaceSchema::Method> *)pNVar11);
    SVar27.content.size_ = (size_t)aVar21.schema;
    SVar27.content.ptr = (char *)sVar9;
    toUpperCase(&upperCase,(CapnpcCppMain *)pcVar12,SVar27);
    pcVar12 = "static ";
    if (local_808.text.content.ptr == (char *)0x1) {
      pcVar12 = "extern ";
    }
    WVar4 = LIST;
    if (type.listDepth == '\0') {
      WVar4 = type.baseType;
    }
    params_1 = &switchD_001855ab::switchdataD_0023f038;
    structNode._reader.segment = (SegmentReader *)pcVar12;
    switch(WVar4) {
    case VOID:
    case FLOAT32:
    case FLOAT64:
      TVar26 = ConstSchema::getType((ConstSchema *)&proto_1);
      capnp::schema::Node::Const::Reader::getValue((Reader *)&builder_4,(Reader *)&defineText);
      value_00._reader.capTable = (CapTableReader *)builder_4.pos;
      value_00._reader.segment = (SegmentReader *)builder_4.ptr;
      value_00._reader.data = builder_4.endPtr;
      value_00._reader.pointers = (WirePointer *)builder_4.disposer;
      value_00._reader._32_8_ = local_948;
      value_00._reader._40_8_ = sStack_940;
      literalValue((StringTree *)local_640,this,TVar26,value_00);
      kj::StringTree::flatten((String *)&builder_1,(StringTree *)local_640);
      kj::StringTree::~StringTree((StringTree *)local_640);
      annotatedName._0_8_ = (ulong)(uint7)annotatedName._1_7_ << 8;
      builder._0_16_ =
           kj::toCharSequence<char_const(&)[28]>((char (*) [28])"static KJ_CONSTEXPR(const) ");
      kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                ((String *)local_640,(kj *)&whichName,builder.pos);
      local_558.ptr._0_1_ = 0x20;
      constType.content.ptr = (char *)upperCase.content.size_;
      if (upperCase.content.size_ != 0) {
        constType.content.ptr = upperCase.content.ptr;
      }
      constType.content.size_ = 0;
      if (upperCase.content.size_ != 0) {
        constType.content.size_ = upperCase.content.size_ - 1;
      }
      local_6f0 = kj::toCharSequence<char_const(&)[36]>
                            ((char (*) [36])" CAPNP_NON_INT_CONSTEXPR_DECL_INIT(");
      local_488.size_ = (size_t)builder_1.pos;
      if (builder_1.pos != (RemoveConst<kj::StringTree> *)0x0) {
        local_488.size_ = (size_t)builder_1.ptr;
      }
      local_488.text.content.ptr = (undefined1 *)0x0;
      if (builder_1.pos != (RemoveConst<kj::StringTree> *)0x0) {
        local_488.text.content.ptr = (undefined1 *)((long)&builder_1.pos[-1].branches.disposer + 7);
      }
      local_448._0_16_ = kj::toCharSequence<char_const(&)[4]>((char (*) [4])0x24115b);
      params_1 = (uint *)&local_448;
      kj::StringTree::
      concat<kj::ArrayPtr<char_const>,kj::String,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                ((StringTree *)&annotatedName.field_1.value,(StringTree *)&builder,
                 (ArrayPtr<const_char> *)local_640,(String *)&local_558,
                 (FixedArray<char,_1UL> *)&constType,&local_6f0,(ArrayPtr<const_char> *)&local_488,
                 (ArrayPtr<const_char> *)&local_448,
                 (ArrayPtr<const_char> *)in_stack_fffffffffffff5f8);
      kj::Array<char>::~Array((Array<char> *)local_640);
      if (local_808.text.content.ptr == (char *)0x1) {
        kj::StringTree::concat<>();
      }
      else {
        builder._0_16_ = kj::toCharSequence<char_const(&)[21]>((char (*) [21])0x242ef6);
        kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                  ((String *)local_640,(kj *)&whichName,builder.pos);
        local_158[0] = 0x20;
        constType.content.size_ = (size_t)(local_808.text.content.ptr + -1);
        constType.content.ptr = (char *)local_808.size_;
        local_6f0.ptr = (char *)upperCase.content.size_;
        if (upperCase.content.size_ != 0) {
          local_6f0.ptr = upperCase.content.ptr;
        }
        local_6f0.size_ = 0;
        if (upperCase.content.size_ != 0) {
          local_6f0.size_ = upperCase.content.size_ - 1;
        }
        local_488._0_16_ =
             kj::toCharSequence<char_const(&)[35]>
                       ((char (*) [35])" CAPNP_NON_INT_CONSTEXPR_DEF_INIT(");
        local_448.size_ = (size_t)builder_1.pos;
        if (builder_1.pos != (RemoveConst<kj::StringTree> *)0x0) {
          local_448.size_ = (size_t)builder_1.ptr;
        }
        local_448.text.content.ptr = (undefined1 *)0x0;
        if (builder_1.pos != (RemoveConst<kj::StringTree> *)0x0) {
          local_448.text.content.ptr =
               (undefined1 *)((long)&builder_1.pos[-1].branches.disposer + 7);
        }
        pAVar31 = (ArrayPtr<const_char> *)0x18749a;
        local_558 = kj::toCharSequence<char_const(&)[4]>((char (*) [4])0x24115b);
        params_1 = (uint *)local_158;
        kj::StringTree::
        concat<kj::ArrayPtr<char_const>,kj::String,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                  ((StringTree *)(local_2e0 + 8),(StringTree *)&builder,
                   (ArrayPtr<const_char> *)local_640,(String *)params_1,
                   (FixedArray<char,_1UL> *)&constType,&local_6f0,(ArrayPtr<const_char> *)&local_488
                   ,(ArrayPtr<const_char> *)&local_448,&local_558,pAVar31);
        kj::Array<char>::~Array((Array<char> *)local_640);
      }
      goto LAB_00187a3b;
    case BOOL:
    case INT8:
    case INT16:
    case INT32:
    case INT64:
    case UINT8:
    case UINT16:
    case UINT32:
    case UINT64:
    case ENUM:
      annotatedName._0_8_ = (ulong)(uint7)annotatedName._1_7_ << 8;
      TVar26 = ConstSchema::getType((ConstSchema *)&proto_1);
      capnp::schema::Node::Const::Reader::getValue((Reader *)&builder_4,(Reader *)&defineText);
      value._reader.capTable = (CapTableReader *)builder_4.pos;
      value._reader.segment = (SegmentReader *)builder_4.ptr;
      value._reader.data = builder_4.endPtr;
      value._reader.pointers = (WirePointer *)builder_4.disposer;
      value._reader._32_8_ = local_948;
      value._reader._40_8_ = sStack_940;
      literalValue((StringTree *)local_640,this,TVar26,value);
      builder._0_16_ = kj::toCharSequence<char_const(&)[18]>((char (*) [18])"static constexpr ");
      kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                ((String *)&builder_1,(kj *)&whichName,builder.pos);
      local_448.size_._0_1_ = 0x20;
      constType.content.ptr = (char *)upperCase.content.size_;
      if (upperCase.content.size_ != 0) {
        constType.content.ptr = upperCase.content.ptr;
      }
      constType.content.size_ = 0;
      if (upperCase.content.size_ != 0) {
        constType.content.size_ = upperCase.content.size_ - 1;
      }
      local_6f0 = kj::toCharSequence<char_const(&)[4]>((char (*) [4])0x241580);
      local_488._0_16_ = kj::toCharSequence<char_const(&)[3]>((char (*) [3])0x24115c);
      params_1 = (uint *)&local_488;
      kj::StringTree::
      concat<kj::ArrayPtr<char_const>,kj::String,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
                ((StringTree *)&annotatedName.field_1.value,(StringTree *)&builder,
                 (ArrayPtr<const_char> *)&builder_1,(String *)&local_448,
                 (FixedArray<char,_1UL> *)&constType,&local_6f0,(ArrayPtr<const_char> *)local_640,
                 &local_488,(ArrayPtr<const_char> *)in_stack_fffffffffffff5f8);
      kj::Array<char>::~Array((Array<char> *)&builder_1);
      if (local_808.text.content.ptr == (char *)0x1) {
        kj::StringTree::concat<>();
      }
      else {
        builder._0_16_ =
             kj::toCharSequence<char_const(&)[28]>((char (*) [28])"#ifndef _MSC_VER\nconstexpr ");
        kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                  ((String *)&builder_1,(kj *)&whichName,builder.pos);
        local_448.size_._0_1_ = 0x20;
        constType.content.size_ = (size_t)(local_808.text.content.ptr + -1);
        constType.content.ptr = (char *)local_808.size_;
        local_6f0.ptr = (char *)upperCase.content.size_;
        if (upperCase.content.size_ != 0) {
          local_6f0.ptr = upperCase.content.ptr;
        }
        local_6f0.size_ = 0;
        if (upperCase.content.size_ != 0) {
          local_6f0.size_ = upperCase.content.size_ - 1;
        }
        params_1 = (uint *)0x185cc4;
        local_488._0_16_ = kj::toCharSequence<char_const(&)[10]>((char (*) [10])";\n#endif\n");
        kj::StringTree::
        concat<kj::ArrayPtr<char_const>,kj::String,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                  ((StringTree *)(local_2e0 + 8),(StringTree *)&builder,
                   (ArrayPtr<const_char> *)&builder_1,(String *)&local_448,
                   (FixedArray<char,_1UL> *)&constType,&local_6f0,(ArrayPtr<const_char> *)&local_488
                   ,(ArrayPtr<const_char> *)params_1);
        kj::Array<char>::~Array((Array<char> *)&builder_1);
      }
      kj::StringTree::~StringTree((StringTree *)local_640);
      break;
    case TEXT:
      RVar28 = ConstSchema::as<capnp::Text>((ConstSchema *)&proto_1);
      builder_1.ptr = (StringTree *)(RVar28.super_StringPtr.content.size_ - 1);
      kj::strTree<char_const(&)[23],unsigned_long,char_const(&)[2]>
                ((StringTree *)local_640,(kj *)"::capnp::_::ConstText<",(char (*) [23])&builder_1,
                 (unsigned_long *)0x24ae2a,&pNVar11->isSet);
      kj::StringTree::flatten((String *)&builder_4,(StringTree *)local_640);
      pacVar32 = (char (*) [3])0x187681;
      kj::StringTree::~StringTree((StringTree *)local_640);
      annotatedName.isSet = true;
      builder.ptr._0_1_ = 0x20;
      kj::strTree<char_const*&,char_const(&)[7],kj::String&,char,kj::String&,char_const(&)[3]>
                ((StringTree *)&annotatedName.field_1.value,(kj *)&structNode,(char **)0x240e03,
                 (char (*) [7])&builder_4,(String *)&builder,(char *)&upperCase,(String *)0x24115c,
                 pacVar32);
      constType.content.ptr._0_1_ = 0x20;
      if ((uint)declareText.branches.ptr < 0x40) {
        uVar17 = 0;
      }
      else {
        uVar17 = *(unsigned_long *)declareText.text.content.size_;
      }
      kj::hex((CappedArray<char,_17UL> *)local_640,uVar17);
      pacVar33 = (char (*) [4])0x1878c1;
      uVar6 = ConstSchema::getValueSchemaOffset((ConstSchema *)&proto_1);
      builder_1.ptr = (StringTree *)CONCAT44(builder_1.ptr._4_4_,uVar6);
      params_1 = (uint *)&constType;
      kj::
      strTree<char_const(&)[7],kj::String&,char,kj::StringPtr&,kj::String&,char_const(&)[22],kj::CappedArray<char,17ul>,char_const(&)[10],unsigned_int,char_const(&)[4]>
                ((StringTree *)(local_2e0 + 8),(kj *)0x240e03,(char (*) [7])&builder_4,
                 (String *)params_1,(char *)&local_808,(StringPtr *)&upperCase,
                 (String *)"(::capnp::schemas::b_",(char (*) [22])local_640,
                 (CappedArray<char,_17UL> *)".words + ",(char (*) [10])&builder_1,(uint *)0x24115b,
                 pacVar33);
      goto LAB_001879a8;
    case DATA:
      RVar29 = ConstSchema::as<capnp::Data>((ConstSchema *)&proto_1);
      builder_1.ptr = (StringTree *)RVar29.super_ArrayPtr<const_unsigned_char>.size_;
      kj::strTree<char_const(&)[23],unsigned_long,char_const(&)[2]>
                ((StringTree *)local_640,(kj *)"::capnp::_::ConstData<",(char (*) [23])&builder_1,
                 (unsigned_long *)0x24ae2a,&pNVar11->isSet);
      kj::StringTree::flatten((String *)&builder_4,(StringTree *)local_640);
      pacVar32 = (char (*) [3])0x18773e;
      kj::StringTree::~StringTree((StringTree *)local_640);
      annotatedName.isSet = true;
      builder.ptr._0_1_ = 0x20;
      kj::strTree<char_const*&,char_const(&)[7],kj::String&,char,kj::String&,char_const(&)[3]>
                ((StringTree *)&annotatedName.field_1.value,(kj *)&structNode,(char **)0x240e03,
                 (char (*) [7])&builder_4,(String *)&builder,(char *)&upperCase,(String *)0x24115c,
                 pacVar32);
      constType.content.ptr._0_1_ = 0x20;
      if ((uint)declareText.branches.ptr < 0x40) {
        uVar17 = 0;
      }
      else {
        uVar17 = *(unsigned_long *)declareText.text.content.size_;
      }
      kj::hex((CappedArray<char,_17UL> *)local_640,uVar17);
      pacVar33 = (char (*) [4])0x18794b;
      uVar6 = ConstSchema::getValueSchemaOffset((ConstSchema *)&proto_1);
      builder_1.ptr = (StringTree *)CONCAT44(builder_1.ptr._4_4_,uVar6);
      params_1 = (uint *)&constType;
      kj::
      strTree<char_const(&)[7],kj::String&,char,kj::StringPtr&,kj::String&,char_const(&)[22],kj::CappedArray<char,17ul>,char_const(&)[10],unsigned_int,char_const(&)[4]>
                ((StringTree *)(local_2e0 + 8),(kj *)0x240e03,(char (*) [7])&builder_4,
                 (String *)params_1,(char *)&local_808,(StringPtr *)&upperCase,
                 (String *)"(::capnp::schemas::b_",(char (*) [22])local_640,
                 (CappedArray<char,_17UL> *)".words + ",(char (*) [10])&builder_1,(uint *)0x24115b,
                 pacVar33);
LAB_001879a8:
      this_00 = &builder_4;
      goto LAB_00187ad3;
    case LIST:
      TVar26 = (Type)Type::asList(&type);
      pAVar31 = (ArrayPtr<const_char> *)local_640;
      local_640[0] = false;
      typeName((CppTypeName *)&builder_4,this,TVar26,
               (Maybe<capnp::InterfaceSchema::Method> *)pAVar31);
      local_6f0 = kj::toCharSequence<char_const(&)[23]>((char (*) [23])"::capnp::_::ConstList<");
      kj::_::toStringTreeOrCharSequence<capnp::(anonymous_namespace)::CppTypeName>
                ((StringTree *)&builder_1,(CppTypeName *)&builder_4);
      local_488._0_16_ = kj::toCharSequence<char_const(&)[2]>((char (*) [2])0x24ae2a);
      kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
                ((StringTree *)&builder,(StringTree *)&local_6f0,(ArrayPtr<const_char> *)&builder_1,
                 &local_488,pAVar31);
      kj::StringTree::~StringTree((StringTree *)&builder_1);
      kj::StringTree::flatten(&constType,(StringTree *)&builder);
      kj::StringTree::~StringTree((StringTree *)&builder);
      pacVar32 = (char (*) [3])0x1875c1;
      kj::StringTree::~StringTree((StringTree *)&builder_4);
      annotatedName.isSet = true;
      builder.ptr._0_1_ = 0x20;
      kj::strTree<char_const*&,char_const(&)[7],kj::String&,char,kj::String&,char_const(&)[3]>
                ((StringTree *)&annotatedName.field_1.value,(kj *)&structNode,(char **)0x240e03,
                 (char (*) [7])&constType,(String *)&builder,(char *)&upperCase,(String *)0x24115c,
                 pacVar32);
      local_6f0.ptr._0_1_ = 0x20;
      if ((uint)declareText.branches.ptr < 0x40) {
        uVar17 = 0;
      }
      else {
        uVar17 = *(unsigned_long *)declareText.text.content.size_;
      }
      kj::hex((CappedArray<char,_17UL> *)&builder_4,uVar17);
      pacVar33 = (char (*) [4])0x187a6d;
      uVar6 = ConstSchema::getValueSchemaOffset((ConstSchema *)&proto_1);
      builder_1.ptr = (StringTree *)CONCAT44(builder_1.ptr._4_4_,uVar6);
      params_1 = (uint *)&local_6f0;
      kj::
      strTree<char_const(&)[7],kj::String&,char,kj::StringPtr&,kj::String&,char_const(&)[22],kj::CappedArray<char,17ul>,char_const(&)[10],unsigned_int,char_const(&)[4]>
                ((StringTree *)(local_2e0 + 8),(kj *)0x240e03,(char (*) [7])&constType,
                 (String *)params_1,(char *)&local_808,(StringPtr *)&upperCase,
                 (String *)"(::capnp::schemas::b_",(char (*) [22])&builder_4,
                 (CappedArray<char,_17UL> *)".words + ",(char (*) [10])&builder_1,(uint *)0x24115b,
                 pacVar33);
      this_00 = (ArrayBuilder<kj::StringTree> *)&constType;
      goto LAB_00187ad3;
    case STRUCT:
      builder._0_16_ =
           kj::toCharSequence<char_const(&)[25]>((char (*) [25])"::capnp::_::ConstStruct<");
      kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                ((String *)&builder_4,(kj *)&whichName,builder.pos);
      constType.content._0_16_ = kj::toCharSequence<char_const(&)[2]>((char (*) [2])0x24ae2a);
      kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
                ((StringTree *)local_640,(StringTree *)&builder,(ArrayPtr<const_char> *)&builder_4,
                 &constType,(ArrayPtr<const_char> *)pNVar11);
      kj::Array<char>::~Array((Array<char> *)&builder_4);
      kj::StringTree::flatten((String *)&builder_1,(StringTree *)local_640);
      pacVar32 = (char (*) [3])0x187835;
      kj::StringTree::~StringTree((StringTree *)local_640);
      annotatedName.isSet = true;
      builder.ptr._0_1_ = 0x20;
      kj::strTree<char_const*&,char_const(&)[7],kj::String&,char,kj::String&,char_const(&)[3]>
                ((StringTree *)&annotatedName.field_1.value,(kj *)&structNode,(char **)0x240e03,
                 (char (*) [7])&builder_1,(String *)&builder,(char *)&upperCase,(String *)0x24115c,
                 pacVar32);
      constType.content.ptr._0_1_ = 0x20;
      if ((uint)declareText.branches.ptr < 0x40) {
        uVar17 = 0;
      }
      else {
        uVar17 = *(unsigned_long *)declareText.text.content.size_;
      }
      kj::hex((CappedArray<char,_17UL> *)local_640,uVar17);
      pacVar33 = (char (*) [4])0x1879dd;
      uVar6 = ConstSchema::getValueSchemaOffset((ConstSchema *)&proto_1);
      builder_4.ptr = (StringTree *)CONCAT44(builder_4.ptr._4_4_,uVar6);
      params_1 = (uint *)&constType;
      kj::
      strTree<char_const(&)[7],kj::String&,char,kj::StringPtr&,kj::String&,char_const(&)[22],kj::CappedArray<char,17ul>,char_const(&)[10],unsigned_int,char_const(&)[4]>
                ((StringTree *)(local_2e0 + 8),(kj *)0x240e03,(char (*) [7])&builder_1,
                 (String *)params_1,(char *)&local_808,(StringPtr *)&upperCase,
                 (String *)"(::capnp::schemas::b_",(char (*) [22])local_640,
                 (CappedArray<char,_17UL> *)".words + ",(char (*) [10])&builder_4,(uint *)0x24115b,
                 pacVar33);
LAB_00187a3b:
      this_00 = &builder_1;
LAB_00187ad3:
      kj::Array<char>::~Array((Array<char> *)this_00);
      break;
    case INTERFACE:
    case ANY_POINTER:
      annotatedName._0_8_ = (ulong)(uint7)annotatedName._1_7_ << 8;
      kj::StringTree::concat<>();
      kj::StringTree::concat<>();
      break;
    default:
      kj::_::unreachable();
    }
    kj::Array<char>::~Array(&upperCase.content);
    kj::StringTree::~StringTree(&whichName.name);
    if (pcVar20 == (char *)0x1) {
      kj::StringTree::concat<>();
      kj::StringTree::StringTree
                (&__return_storage_ptr__->outerTypeDef,(StringTree *)&annotatedName.field_1.value);
    }
    else {
      kj::strTree<char_const(&)[3],kj::StringTree>
                (&__return_storage_ptr__->outerTypeDecl,(kj *)0x23fc44,
                 (char (*) [3])&annotatedName.field_1,(StringTree *)params_1);
      kj::StringTree::concat<>();
    }
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::StringTree
              (&__return_storage_ptr__->sourceFileDefs,(StringTree *)(local_2e0 + 8));
    ConstText::~ConstText((ConstText *)&annotatedName);
    break;
  case 5:
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    break;
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

NodeText makeNodeTextWithoutNested(kj::StringPtr namespace_, kj::StringPtr scope,
                                     kj::StringPtr name, Schema schema,
                                     kj::Array<kj::StringTree> nestedTypeDecls,
                                     const TemplateContext& templateContext) {
    auto proto = schema.getProto();
    KJ_IF_MAYBE(annotatedName, annotationValue(proto, NAME_ANNOTATION_ID)) {
      name = annotatedName->getText();
    }
    auto hexId = kj::hex(proto.getId());

    switch (proto.which()) {
      case schema::Node::FILE:
        KJ_FAIL_REQUIRE("This method shouldn't be called on file nodes.");

      case schema::Node::STRUCT: {
        StructText structText =
            makeStructText(scope, name, schema.asStruct(), kj::mv(nestedTypeDecls),
                           templateContext);

        return NodeText {
          kj::mv(structText.outerTypeDecl),
          kj::mv(structText.outerTypeDef),
          kj::mv(structText.readerBuilderDefs),
          kj::mv(structText.inlineMethodDefs),

          kj::strTree(),
          kj::strTree(),

          kj::mv(structText.sourceDefs),
        };
      }

      case schema::Node::ENUM: {
        auto enumerants = schema.asEnum().getEnumerants();

        return NodeText {
          scope.size() == 0 ? kj::strTree() : kj::strTree(
              "  typedef ::capnp::schemas::", name, "_", hexId, " ", name, ";\n"
              "\n"),

          scope.size() > 0 ? kj::strTree() : kj::strTree(
              "typedef ::capnp::schemas::", name, "_", hexId, " ", name, ";\n"
              "\n"),

          kj::strTree(),
          kj::strTree(),

          kj::strTree(
              // We declare enums in the capnp::schemas namespace and then typedef them into
              // place because we don't want them to be parameterized for generics.
              "enum class ", name, "_", hexId, ": uint16_t {\n",
              KJ_MAP(e, enumerants) {
                return kj::strTree("  ", toUpperCase(protoName(e.getProto())), ",\n");
              },
              "};\n"
              "CAPNP_DECLARE_ENUM(", name, ", ", hexId, ");\n"),
          kj::strTree(
              "CAPNP_DEFINE_ENUM(", name, "_", hexId, ", ", hexId, ");\n"),

          kj::strTree(),
        };
      }

      case schema::Node::INTERFACE: {
        hasInterfaces = true;

        InterfaceText interfaceText =
            makeInterfaceText(scope, name, schema.asInterface(), kj::mv(nestedTypeDecls),
                              templateContext);

        return NodeText {
          kj::mv(interfaceText.outerTypeDecl),
          kj::mv(interfaceText.outerTypeDef),
          kj::mv(interfaceText.clientServerDefs),
          kj::mv(interfaceText.inlineMethodDefs),

          kj::strTree(),
          kj::strTree(),

          kj::mv(interfaceText.sourceDefs),
        };
      }

      case schema::Node::CONST: {
        auto constText = makeConstText(scope, name, schema.asConst(), templateContext);

        return NodeText {
          scope.size() == 0 ? kj::strTree() : kj::strTree("  ", kj::mv(constText.decl)),
          scope.size() > 0 ? kj::strTree() : kj::mv(constText.decl),
          kj::strTree(),
          kj::strTree(),

          kj::strTree(),
          kj::strTree(),

          kj::mv(constText.def),
        };
      }

      case schema::Node::ANNOTATION: {
        return NodeText {
          kj::strTree(),
          kj::strTree(),
          kj::strTree(),
          kj::strTree(),

          kj::strTree(),
          kj::strTree(),

          kj::strTree(),
        };
      }
    }

    KJ_UNREACHABLE;
  }